

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O1

void AddContent(QuadTreeNode *Tree,Container *NewContent,int divider)

{
  undefined8 *puVar1;
  Container *pCVar2;
  int iVar3;
  Container *pCVar4;
  QuadTreeNode *pQVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  iVar3 = Separated(&((NewContent->Content).E)->Bounder,&Tree->Bounder);
  if (iVar3 == 0) {
    if (Tree->Children == (QuadTreeNode *)0x0) {
      iVar3 = Tree->NumContents + 1;
      Tree->NumContents = iVar3;
      pCVar2 = Tree->Contents;
      pCVar4 = (Container *)malloc(0x18);
      Tree->Contents = pCVar4;
      pCVar4->Content = NewContent->Content;
      pCVar4->Type = NewContent->Type;
      pCVar4->Next = pCVar2;
      if (((iVar3 == divider) &&
          ((double)screen_width < (Tree->Bounder).BR.Pos[0] - (Tree->Bounder).TL.Pos[0])) &&
         ((double)screen_height < (Tree->Bounder).BR.Pos[1] - (Tree->Bounder).TL.Pos[1])) {
        pQVar5 = (QuadTreeNode *)malloc(0x120);
        Tree->Children = pQVar5;
        uVar6 = 3;
        lVar7 = 0x100;
        do {
          dVar9 = (Tree->Bounder).TL.Pos[0];
          if ((uVar6 & 1) != 0) {
            dVar9 = (dVar9 + (Tree->Bounder).BR.Pos[0]) * 0.5;
          }
          dVar10 = (Tree->Bounder).TL.Pos[1];
          if ((uVar6 & 2) != 0) {
            dVar10 = (dVar10 + (Tree->Bounder).BR.Pos[1]) * 0.5;
          }
          if ((uVar6 & 1) == 0) {
            dVar11 = ((Tree->Bounder).TL.Pos[0] + (Tree->Bounder).BR.Pos[0]) * 0.5;
          }
          else {
            dVar11 = (Tree->Bounder).BR.Pos[0];
          }
          if ((uVar6 & 2) == 0) {
            dVar12 = ((Tree->Bounder).TL.Pos[1] + (Tree->Bounder).BR.Pos[1]) * 0.5;
          }
          else {
            dVar12 = (Tree->Bounder).BR.Pos[1];
          }
          pQVar5 = Tree->Children;
          *(double *)((long)(pQVar5->Bounder).TL.Pos + lVar7 + -0x28) = (double)(int)dVar9;
          *(double *)((long)(&pQVar5->Bounder + -1) + lVar7) = (double)(int)dVar10;
          *(double *)((long)(pQVar5->Bounder).TL.Pos + lVar7 + -0x18) = (double)(int)dVar11;
          *(double *)((long)(&(pQVar5->Bounder).TL + -1) + lVar7) = (double)(int)dVar12;
          *(undefined4 *)((long)(pQVar5->Bounder).TL.Pos + lVar7 + -8) = 0;
          puVar1 = (undefined8 *)((long)(pQVar5->Bounder).TL.Pos + lVar7);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)(pQVar5->Bounder).BR.Pos + lVar7) = 0;
          lVar7 = lVar7 + -0x48;
          bVar8 = uVar6 != 0;
          uVar6 = uVar6 - 1;
        } while (bVar8);
        pCVar2 = Tree->Contents;
        while (pCVar2 != (Container *)0x0) {
          pCVar4 = pCVar2->Next;
          lVar7 = 0xd8;
          do {
            AddContent((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar7),pCVar2,
                       divider);
            lVar7 = lVar7 + -0x48;
          } while (lVar7 != -0x48);
          free(pCVar2);
          pCVar2 = pCVar4;
        }
        Tree->Contents = (Container *)0x0;
      }
    }
    else {
      lVar7 = 0xd8;
      do {
        AddContent((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar7),NewContent,
                   divider);
        lVar7 = lVar7 + -0x48;
      } while (lVar7 != -0x48);
    }
  }
  return;
}

Assistant:

static void AddContent(struct QuadTreeNode *Tree, struct Container *NewContent,
                int divider)
{
   int c;
   struct Container *CPtr, *Next;

   /*

      First check: does the refered new content actually overlap with this
      node? If not, do nothing

      NB: this code explicitly checks the bounding box of an 'edge' held in
      NewContent, even though it may hold an edge, triangle or object. This is
      fine because we've set up our structs so that the bounding box
      information is at the same location regardless

    */
   if (Separated(&NewContent->Content.E->Bounder, &Tree->Bounder))
      return;

   /*

      Second check: has this node been subdivided? If so, pass on for
      children to deal with

    */
   if (Tree->Children) {
      c = 4;
      while (c--)
         AddContent(&Tree->Children[c], NewContent, divider);
   } else {
      /*

         If we're here, then the edge really does need to be added to the
         current node, so do that

       */
      Tree->NumContents++;
      CPtr = Tree->Contents;
      Tree->Contents = (struct Container *)malloc(sizeof(struct Container));
      Tree->Contents->Content = NewContent->Content;
      Tree->Contents->Type = NewContent->Type;
      Tree->Contents->Next = CPtr;

      /*

         Now check if we've hit the maximum content count for this node. If
         so, subdivide

       */
      if ((Tree->NumContents == divider)
          && ((Tree->Bounder.BR.Pos[0] - Tree->Bounder.TL.Pos[0]) > screen_width)
          && ((Tree->Bounder.BR.Pos[1] - Tree->Bounder.TL.Pos[1]) > screen_height)) {
         /* allocate new memory and set up structures */
         Tree->Children =
            (struct QuadTreeNode *)malloc(sizeof(struct QuadTreeNode)
                                          * 4);
         c = 4;
         while (c--)
            SetupQuadTree(&Tree->Children[c],
                          GetX1(c, &Tree->Bounder), GetY1(c,
                                                          &Tree->
                                                          Bounder),
                          GetX2(c, &Tree->Bounder), GetY2(c, &Tree->Bounder));

         /* redistribute contents currently stored here */
         CPtr = Tree->Contents;
         while (CPtr) {
            Next = CPtr->Next;

            c = 4;
            while (c--)
               AddContent(&Tree->Children[c], CPtr, divider);

            free(CPtr);
            CPtr = Next;
         }
         Tree->Contents = NULL;
      }
   }
}